

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgConvexHull3d.cpp
# Opt level: O2

HaF64 __thiscall
dgConvexHull3DFace::Evalue(dgConvexHull3DFace *this,dgBigVector *pointArray,dgBigVector *point)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  HaI32 i;
  HaI32 HVar5;
  long lVar6;
  dgGoogol *pdVar7;
  dgTemplateVector<double> *this_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  dgGoogol exactDet;
  HaF64 error;
  HaF64 matrix [3] [3];
  dgGoogol local_278;
  dgTemplateVector<double> *local_250;
  dgTemplateVector<double> *local_248;
  double local_240;
  dgGoogol local_238;
  dgGoogol local_210;
  HaF64 local_1e8 [3];
  double adStack_1d0 [7];
  dgGoogol local_198 [9];
  undefined1 extraout_var [56];
  
  iVar2 = this->m_index[1];
  iVar3 = this->m_index[2];
  this_00 = &pointArray[this->m_index[0]].super_dgTemplateVector<double>;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    HVar5 = (HaI32)lVar6;
    pdVar4 = dgTemplateVector<double>::operator[]
                       (&pointArray[iVar3].super_dgTemplateVector<double>,HVar5);
    dVar1 = *pdVar4;
    pdVar4 = dgTemplateVector<double>::operator[](this_00,HVar5);
    local_1e8[lVar6] = (HaF64)(dVar1 - *pdVar4);
    pdVar4 = dgTemplateVector<double>::operator[]
                       (&pointArray[iVar2].super_dgTemplateVector<double>,HVar5);
    dVar1 = *pdVar4;
    pdVar4 = dgTemplateVector<double>::operator[](this_00,HVar5);
    adStack_1d0[lVar6] = dVar1 - *pdVar4;
    pdVar4 = dgTemplateVector<double>::operator[](&point->super_dgTemplateVector<double>,HVar5);
    dVar1 = *pdVar4;
    pdVar4 = dgTemplateVector<double>::operator[](this_00,HVar5);
    adStack_1d0[lVar6 + 3] = dVar1 - *pdVar4;
  }
  auVar9._0_8_ = Determinant3x3(&local_1e8,(HaF64 *)&local_240);
  auVar9._8_56_ = extraout_var;
  auVar8._8_8_ = 0x7fffffffffffffff;
  auVar8._0_8_ = 0x7fffffffffffffff;
  auVar8 = vandpd_avx512vl(auVar9._0_16_,auVar8);
  if (auVar8._0_8_ <= local_240 * 5.9604644775390625e-08) {
    lVar6 = 0;
    do {
      dgGoogol::dgGoogol((dgGoogol *)((long)local_198[0].m_mantissa + lVar6 + -8));
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0x168);
    pdVar7 = local_198;
    lVar6 = 0;
    local_250 = &point->super_dgTemplateVector<double>;
    local_248 = &pointArray[iVar2].super_dgTemplateVector<double>;
    for (; lVar6 != 3; lVar6 = lVar6 + 1) {
      HVar5 = (HaI32)lVar6;
      pdVar4 = dgTemplateVector<double>::operator[]
                         (&pointArray[iVar3].super_dgTemplateVector<double>,HVar5);
      dgGoogol::dgGoogol(&local_210,(HaF64)*pdVar4);
      pdVar4 = dgTemplateVector<double>::operator[](this_00,HVar5);
      dgGoogol::dgGoogol(&local_238,(HaF64)*pdVar4);
      dgGoogol::operator-(&local_278,&local_210,&local_238);
      pdVar7->m_mantissa[3] = local_278.m_mantissa[3];
      pdVar7->m_sign = local_278.m_sign;
      pdVar7->field_0x1 = local_278._1_1_;
      pdVar7->m_exponent = local_278.m_exponent;
      *(undefined4 *)&pdVar7->field_0x4 = local_278._4_4_;
      pdVar7->m_mantissa[0] = local_278.m_mantissa[0];
      pdVar7->m_mantissa[1] = local_278.m_mantissa[1];
      pdVar7->m_mantissa[2] = local_278.m_mantissa[2];
      dgGoogol::~dgGoogol(&local_278);
      dgGoogol::~dgGoogol(&local_238);
      dgGoogol::~dgGoogol(&local_210);
      pdVar4 = dgTemplateVector<double>::operator[](local_248,HVar5);
      dgGoogol::dgGoogol(&local_210,(HaF64)*pdVar4);
      pdVar4 = dgTemplateVector<double>::operator[](this_00,HVar5);
      dgGoogol::dgGoogol(&local_238,(HaF64)*pdVar4);
      dgGoogol::operator-(&local_278,&local_210,&local_238);
      pdVar7[3].m_mantissa[3] = local_278.m_mantissa[3];
      pdVar7[3].m_sign = local_278.m_sign;
      pdVar7[3].field_0x1 = local_278._1_1_;
      pdVar7[3].m_exponent = local_278.m_exponent;
      *(undefined4 *)&pdVar7[3].field_0x4 = local_278._4_4_;
      pdVar7[3].m_mantissa[0] = local_278.m_mantissa[0];
      pdVar7[3].m_mantissa[1] = local_278.m_mantissa[1];
      pdVar7[3].m_mantissa[2] = local_278.m_mantissa[2];
      dgGoogol::~dgGoogol(&local_278);
      dgGoogol::~dgGoogol(&local_238);
      dgGoogol::~dgGoogol(&local_210);
      pdVar4 = dgTemplateVector<double>::operator[](local_250,HVar5);
      dgGoogol::dgGoogol(&local_210,(HaF64)*pdVar4);
      pdVar4 = dgTemplateVector<double>::operator[](this_00,HVar5);
      dgGoogol::dgGoogol(&local_238,(HaF64)*pdVar4);
      dgGoogol::operator-(&local_278,&local_210,&local_238);
      pdVar7[6].m_mantissa[3] = local_278.m_mantissa[3];
      pdVar7[6].m_sign = local_278.m_sign;
      pdVar7[6].field_0x1 = local_278._1_1_;
      pdVar7[6].m_exponent = local_278.m_exponent;
      *(undefined4 *)&pdVar7[6].field_0x4 = local_278._4_4_;
      pdVar7[6].m_mantissa[0] = local_278.m_mantissa[0];
      pdVar7[6].m_mantissa[1] = local_278.m_mantissa[1];
      pdVar7[6].m_mantissa[2] = local_278.m_mantissa[2];
      dgGoogol::~dgGoogol(&local_278);
      dgGoogol::~dgGoogol(&local_238);
      dgGoogol::~dgGoogol(&local_210);
      pdVar7 = pdVar7 + 1;
    }
    Determinant3x3(&local_278,(dgGoogol (*) [3])local_198);
    auVar9._0_8_ = dgGoogol::GetAproximateValue(&local_278);
    dgGoogol::~dgGoogol(&local_278);
    lVar6 = 0x140;
    do {
      dgGoogol::~dgGoogol((dgGoogol *)((long)local_198[0].m_mantissa + lVar6 + -8));
      lVar6 = lVar6 + -0x28;
    } while (lVar6 != -0x28);
  }
  return auVar9._0_8_;
}

Assistant:

hacd::HaF64 dgConvexHull3DFace::Evalue (const dgBigVector* const pointArray, const dgBigVector& point) const
{
	const dgBigVector& p0 = pointArray[m_index[0]];
	const dgBigVector& p1 = pointArray[m_index[1]];
	const dgBigVector& p2 = pointArray[m_index[2]];

	hacd::HaF64 matrix[3][3];
	for (hacd::HaI32 i = 0; i < 3; i ++) {
		matrix[0][i] = p2[i] - p0[i];
		matrix[1][i] = p1[i] - p0[i];
		matrix[2][i] = point[i] - p0[i];
	}

	hacd::HaF64 error;
	hacd::HaF64 det = Determinant3x3 (matrix, &error);
	hacd::HaF64 precision  = hacd::HaF64 (1.0f) / hacd::HaF64 (1<<24);
	hacd::HaF64 errbound = error * precision; 
	if (fabs(det) > errbound) {
		return det;
	}

	dgGoogol exactMatrix[3][3];
	for (hacd::HaI32 i = 0; i < 3; i ++) {
		exactMatrix[0][i] = dgGoogol(p2[i]) - dgGoogol(p0[i]);
		exactMatrix[1][i] = dgGoogol(p1[i]) - dgGoogol(p0[i]);
		exactMatrix[2][i] = dgGoogol(point[i]) - dgGoogol(p0[i]);
	}

	dgGoogol exactDet (Determinant3x3(exactMatrix));
	det = exactDet.GetAproximateValue();
	return det;
}